

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp_launcher.cpp
# Opt level: O1

void lscpp::launch(lsp_server *server,launch_config *config,transporter *transporter_)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Result_base *this;
  undefined8 uVar5;
  timespec *__state_00;
  _State_baseV2 *__tmp;
  _State_baseV2 *this_00;
  bool bVar6;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  future<void> rcv;
  undefined2 local_6c;
  undefined1 local_6a;
  timespec local_68;
  long *local_58;
  __basic_future<void> local_50;
  _func_int **local_40 [2];
  
  if (0 < (long)config->startup_delay) {
    local_68.tv_nsec = 0;
    local_68.tv_sec = (long)config->startup_delay;
    do {
      iVar2 = nanosleep(&local_68,&local_68);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  local_6a = 0;
  local_6c = 0;
  loguru::g_stderr_verbosity = 0xfffffff7;
  loguru::g_colorlogtostderr = 0;
  if ((config->logger).filename._M_string_length != 0) {
    loguru::add_file((config->logger).filename._M_dataplus._M_p,Truncate,(config->logger).verbosity)
    ;
  }
  local_68.tv_sec = 0;
  local_68.tv_nsec = 0;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00677e38;
  this_00 = (_State_baseV2 *)(p_Var4 + 1);
  p_Var4[2]._M_use_count = 0;
  p_Var4[1]._M_use_count = 0;
  p_Var4[1]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
  p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var4[3]._M_use_count = 0;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00677e88;
  this = (_Result_base *)operator_new(0x10);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  std::__future_base::_Result_base::_Result_base(this);
  *(undefined ***)this = &PTR__M_destroy_006780a0;
  p_Var4[4]._vptr__Sp_counted_base = (_func_int **)this;
  *(transporter **)&p_Var4[4]._M_use_count = transporter_;
  p_Var4[5]._vptr__Sp_counted_base = (_func_int **)&local_6c;
  *(lsp_server **)&p_Var4[5]._M_use_count = server;
  local_40[0] = (_func_int **)0x0;
  local_58 = (long *)operator_new(0x20);
  *local_58 = (long)&PTR___State_00677ee0;
  local_58[1] = (long)this_00;
  local_58[2] = (long)std::__future_base::
                      _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/src/lsp_launcher.cpp:47:45)>_>,_void>
                      ::_M_run;
  local_58[3] = 0;
  std::thread::_M_start_thread(local_40,&local_58,0);
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 8))();
  }
  lVar1 = local_68.tv_nsec;
  if (p_Var4[3]._vptr__Sp_counted_base == (_func_int **)0x0) {
    p_Var4[3]._vptr__Sp_counted_base = local_40[0];
    bVar6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.tv_nsec !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.tv_sec = (__time_t)this_00;
    local_68.tv_nsec = (long)p_Var4;
    if (bVar6) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar1);
    }
    if ((_State_baseV2 *)local_68.tv_sec == (_State_baseV2 *)0x0) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      p_Var4->_M_use_count = 1;
      p_Var4->_M_weak_count = 1;
      p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00677f20;
      this_00 = (_State_baseV2 *)(p_Var4 + 1);
      p_Var4[2]._M_use_count = 0;
      p_Var4[1]._M_use_count = 0;
      p_Var4[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var4[1]._M_weak_count + 1) = 0;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00677f70;
      this = (_Result_base *)operator_new(0x10);
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      std::__future_base::_Result_base::_Result_base(this);
      lVar1 = local_68.tv_nsec;
      *(undefined ***)this = &PTR__M_destroy_006780a0;
      p_Var4[3]._vptr__Sp_counted_base = (_func_int **)this;
      *(transporter **)&p_Var4[3]._M_use_count = transporter_;
      p_Var4[4]._vptr__Sp_counted_base = (_func_int **)&local_6c;
      *(lsp_server **)&p_Var4[4]._M_use_count = server;
      bVar6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.tv_nsec !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68.tv_sec = (__time_t)this_00;
      local_68.tv_nsec = (long)p_Var4;
      if (bVar6) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar1);
      }
    }
    __state_00 = &local_68;
    std::__basic_future<void>::__basic_future(&local_50,(__state_type *)__state_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.tv_nsec !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.tv_nsec);
    }
    if (local_50._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (_State_baseV2 *)0x0) {
      std::__future_base::_State_baseV2::wait
                (local_50._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,__state_00);
      if (local_50._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    uVar5 = std::__throw_future_error(3);
    operator_delete(this,0x10);
    std::__future_base::_State_baseV2::~_State_baseV2(this_00);
    operator_delete(p_Var4,0x50);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.tv_nsec !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.tv_nsec);
    }
    _Unwind_Resume(uVar5);
  }
  std::terminate();
}

Assistant:

void launch(lsp_server &&server, launch_config config,
            transporter &&transporter_) {

  // Allows to attach a debugger,
  // before the language server starts to communicate with the client.
  std::this_thread::sleep_for(std::chrono::seconds(config.startup_delay));

  // If we want to play with different message handlers, we can revert to a
  // templated launch (or duplicate the launch as long as it is simple)
  lsp_message_handler message_handler{};

  // setup logger
  loguru::g_stderr_verbosity = loguru::Verbosity_OFF;
  loguru::g_colorlogtostderr = false;
  if (config.logger.filename.size() > 0)
    loguru::add_file(config.logger.filename.c_str(), loguru::Truncate,
                     config.logger.verbosity);

  auto rcv = std::async(std::launch::async, [&]() {
    while (true) {
      auto header = parse_header(transporter_);
      LOG_F(INFO, "content-length: '%d'", header.content_length);
      if (header.content_length <
          0) { // TODO parse header should not use -1 to report an error
        continue;
      }
      auto msg = transporter_.read_message(header.content_length);
      LOG_F(INFO, "msg: '%s'", msg.c_str());

      auto result = message_handler.handle_message(server, msg);
      if (result) {
        LOG_F(INFO, "Sending response: '%s'", (*result).c_str());
        write_lsp_message(transporter_, *result);
      }
    }
  });

  rcv.wait();
}